

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct32_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar34 = (long)bit * 0x100;
  iVar23 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x248);
  iVar24 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x228);
  iVar25 = -*(int *)((long)vert_filter_length_chroma + lVar34 + 0x230);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x240);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1c0);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x200);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x180);
  iVar36 = -iVar4;
  iVar33 = -iVar5;
  iVar37 = -iVar2;
  iVar31 = -iVar3;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1e0);
  iVar28 = -iVar6;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x220);
  iVar29 = -iVar7;
  iVar32 = 1 << ((char)bit - 1U & 0x1f);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar34 + 0x1a0);
  iVar35 = -iVar8;
  iVar30 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_4a0 = 0x8000;
  if (0xf < iVar30) {
    local_4a0 = 1 << ((char)iVar30 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 600);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x198);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x238);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  local_480 = -local_4a0;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x178);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  local_4a0 = local_4a0 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x188);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x168);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  auVar58._16_4_ = uVar1;
  auVar58._20_4_ = uVar1;
  auVar58._24_4_ = uVar1;
  auVar58._28_4_ = uVar1;
  auVar38._4_4_ = iVar23;
  auVar38._0_4_ = iVar23;
  auVar38._8_4_ = iVar23;
  auVar38._12_4_ = iVar23;
  auVar38._16_4_ = iVar23;
  auVar38._20_4_ = iVar23;
  auVar38._24_4_ = iVar23;
  auVar38._28_4_ = iVar23;
  auVar48._4_4_ = iVar24;
  auVar48._0_4_ = iVar24;
  auVar48._8_4_ = iVar24;
  auVar48._12_4_ = iVar24;
  auVar48._16_4_ = iVar24;
  auVar48._20_4_ = iVar24;
  auVar48._24_4_ = iVar24;
  auVar48._28_4_ = iVar24;
  auVar58 = vpmulld_avx2(auVar58,(undefined1  [32])in[1]);
  auVar53 = vpmulld_avx2(auVar53,(undefined1  [32])in[1]);
  auVar48 = vpmulld_avx2(auVar48,(undefined1  [32])in[7]);
  auVar54 = vpmulld_avx2(auVar54,(undefined1  [32])in[7]);
  auVar56 = vpmulld_avx2(auVar56,(undefined1  [32])in[5]);
  auVar44 = vpmulld_avx2(auVar50,(undefined1  [32])in[5]);
  auVar38 = vpmulld_avx2(auVar38,(undefined1  [32])in[3]);
  auVar50 = vpmulld_avx2(auVar55,(undefined1  [32])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x170);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  auVar39 = vpmulld_avx2(auVar39,(undefined1  [32])in[2]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 0x250);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar40 = vpmulld_avx2(auVar40,(undefined1  [32])in[2]);
  auVar41._4_4_ = iVar25;
  auVar41._0_4_ = iVar25;
  auVar41._8_4_ = iVar25;
  auVar41._12_4_ = iVar25;
  auVar41._16_4_ = iVar25;
  auVar41._20_4_ = iVar25;
  auVar41._24_4_ = iVar25;
  auVar41._28_4_ = iVar25;
  auVar41 = vpmulld_avx2(auVar41,(undefined1  [32])in[6]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar34 + 400);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  auVar42 = vpmulld_avx2(auVar42,(undefined1  [32])in[6]);
  auVar59._4_4_ = iVar2;
  auVar59._0_4_ = iVar2;
  auVar59._8_4_ = iVar2;
  auVar59._12_4_ = iVar2;
  auVar59._16_4_ = iVar2;
  auVar59._20_4_ = iVar2;
  auVar59._24_4_ = iVar2;
  auVar59._28_4_ = iVar2;
  auVar43._4_4_ = iVar33;
  auVar43._0_4_ = iVar33;
  auVar43._8_4_ = iVar33;
  auVar43._12_4_ = iVar33;
  auVar43._16_4_ = iVar33;
  auVar43._20_4_ = iVar33;
  auVar43._24_4_ = iVar33;
  auVar43._28_4_ = iVar33;
  auVar49._4_4_ = iVar32;
  auVar49._0_4_ = iVar32;
  auVar49._8_4_ = iVar32;
  auVar49._12_4_ = iVar32;
  auVar49._16_4_ = iVar32;
  auVar49._20_4_ = iVar32;
  auVar49._24_4_ = iVar32;
  auVar49._28_4_ = iVar32;
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar9 = vpsrad_avx2(auVar58,ZEXT416((uint)bit));
  auVar58 = vpaddd_avx2(auVar53,auVar49);
  auVar10 = vpsrad_avx2(auVar58,ZEXT416((uint)bit));
  auVar58 = vpmulld_avx2(auVar10,auVar43);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar53 = vpmulld_avx2(auVar9,auVar59);
  auVar58 = vpaddd_avx2(auVar58,auVar53);
  auVar52._4_4_ = iVar5;
  auVar52._0_4_ = iVar5;
  auVar52._8_4_ = iVar5;
  auVar52._12_4_ = iVar5;
  auVar52._16_4_ = iVar5;
  auVar52._20_4_ = iVar5;
  auVar52._24_4_ = iVar5;
  auVar52._28_4_ = iVar5;
  auVar53 = vpmulld_avx2(auVar10,auVar59);
  auVar53 = vpaddd_avx2(auVar53,auVar49);
  auVar55 = vpmulld_avx2(auVar9,auVar52);
  auVar53 = vpaddd_avx2(auVar53,auVar55);
  auVar48 = vpaddd_avx2(auVar48,auVar49);
  auVar65 = ZEXT416((uint)bit);
  auVar11 = vpsrad_avx2(auVar48,auVar65);
  auVar61._4_4_ = iVar37;
  auVar61._0_4_ = iVar37;
  auVar61._8_4_ = iVar37;
  auVar61._12_4_ = iVar37;
  auVar61._16_4_ = iVar37;
  auVar61._20_4_ = iVar37;
  auVar61._24_4_ = iVar37;
  auVar61._28_4_ = iVar37;
  auVar48 = vpaddd_avx2(auVar54,auVar49);
  auVar12 = vpsrad_avx2(auVar48,auVar65);
  auVar54 = vpmulld_avx2(auVar11,auVar61);
  auVar48 = vpmulld_avx2(auVar12,auVar43);
  auVar48 = vpaddd_avx2(auVar48,auVar49);
  auVar48 = vpaddd_avx2(auVar48,auVar54);
  auVar52 = vpmulld_avx2(auVar52,(undefined1  [32])in[4]);
  auVar61 = vpmulld_avx2(auVar59,(undefined1  [32])in[4]);
  auVar55 = vpmulld_avx2(auVar11,auVar43);
  auVar54 = vpmulld_avx2(auVar12,auVar59);
  auVar54 = vpaddd_avx2(auVar49,auVar54);
  auVar54 = vpaddd_avx2(auVar55,auVar54);
  auVar60._4_4_ = iVar3;
  auVar60._0_4_ = iVar3;
  auVar60._8_4_ = iVar3;
  auVar60._12_4_ = iVar3;
  auVar60._16_4_ = iVar3;
  auVar60._20_4_ = iVar3;
  auVar60._24_4_ = iVar3;
  auVar60._28_4_ = iVar3;
  auVar56 = vpaddd_avx2(auVar56,auVar49);
  auVar59 = vpsrad_avx2(auVar56,auVar65);
  auVar62._4_4_ = iVar36;
  auVar62._0_4_ = iVar36;
  auVar62._8_4_ = iVar36;
  auVar62._12_4_ = iVar36;
  auVar62._16_4_ = iVar36;
  auVar62._20_4_ = iVar36;
  auVar62._24_4_ = iVar36;
  auVar62._28_4_ = iVar36;
  auVar56 = vpaddd_avx2(auVar44,auVar49);
  auVar13 = vpsrad_avx2(auVar56,auVar65);
  auVar56 = vpmulld_avx2(auVar13,auVar62);
  auVar56 = vpaddd_avx2(auVar56,auVar49);
  auVar44 = vpmulld_avx2(auVar59,auVar60);
  auVar56 = vpaddd_avx2(auVar56,auVar44);
  auVar44._4_4_ = iVar4;
  auVar44._0_4_ = iVar4;
  auVar44._8_4_ = iVar4;
  auVar44._12_4_ = iVar4;
  auVar44._16_4_ = iVar4;
  auVar44._20_4_ = iVar4;
  auVar44._24_4_ = iVar4;
  auVar44._28_4_ = iVar4;
  auVar55 = vpmulld_avx2(auVar59,auVar44);
  auVar44 = vpmulld_avx2(auVar13,auVar60);
  auVar44 = vpaddd_avx2(auVar44,auVar49);
  auVar44 = vpaddd_avx2(auVar44,auVar55);
  auVar38 = vpaddd_avx2(auVar38,auVar49);
  auVar65 = ZEXT416((uint)bit);
  auVar14 = vpsrad_avx2(auVar38,auVar65);
  auVar38 = vpaddd_avx2(auVar50,auVar49);
  auVar15 = vpsrad_avx2(auVar38,auVar65);
  auVar57._4_4_ = iVar31;
  auVar57._0_4_ = iVar31;
  auVar57._8_4_ = iVar31;
  auVar57._12_4_ = iVar31;
  auVar57._16_4_ = iVar31;
  auVar57._20_4_ = iVar31;
  auVar57._24_4_ = iVar31;
  auVar57._28_4_ = iVar31;
  auVar50 = vpmulld_avx2(auVar14,auVar57);
  auVar38 = vpmulld_avx2(auVar15,auVar62);
  auVar38 = vpaddd_avx2(auVar38,auVar49);
  auVar38 = vpaddd_avx2(auVar50,auVar38);
  auVar55 = vpmulld_avx2(auVar14,auVar62);
  auVar50 = vpmulld_avx2(auVar15,auVar60);
  auVar50 = vpaddd_avx2(auVar50,auVar49);
  auVar50 = vpaddd_avx2(auVar55,auVar50);
  auVar64._4_4_ = iVar7;
  auVar64._0_4_ = iVar7;
  auVar64._8_4_ = iVar7;
  auVar64._12_4_ = iVar7;
  auVar64._16_4_ = iVar7;
  auVar64._20_4_ = iVar7;
  auVar64._24_4_ = iVar7;
  auVar64._28_4_ = iVar7;
  auVar63._4_4_ = iVar35;
  auVar63._0_4_ = iVar35;
  auVar63._8_4_ = iVar35;
  auVar63._12_4_ = iVar35;
  auVar63._16_4_ = iVar35;
  auVar63._20_4_ = iVar35;
  auVar63._24_4_ = iVar35;
  auVar63._28_4_ = iVar35;
  auVar39 = vpaddd_avx2(auVar49,auVar39);
  auVar57 = vpsrad_avx2(auVar39,auVar65);
  auVar39 = vpaddd_avx2(auVar49,auVar40);
  auVar60 = vpsrad_avx2(auVar39,auVar65);
  auVar39 = vpmulld_avx2(auVar60,auVar63);
  auVar39 = vpaddd_avx2(auVar39,auVar49);
  auVar40 = vpmulld_avx2(auVar57,auVar64);
  auVar39 = vpaddd_avx2(auVar39,auVar40);
  auVar51._4_4_ = iVar6;
  auVar51._0_4_ = iVar6;
  auVar51._8_4_ = iVar6;
  auVar51._12_4_ = iVar6;
  auVar51._16_4_ = iVar6;
  auVar51._20_4_ = iVar6;
  auVar51._24_4_ = iVar6;
  auVar51._28_4_ = iVar6;
  auVar45._4_4_ = iVar8;
  auVar45._0_4_ = iVar8;
  auVar45._8_4_ = iVar8;
  auVar45._12_4_ = iVar8;
  auVar45._16_4_ = iVar8;
  auVar45._20_4_ = iVar8;
  auVar45._24_4_ = iVar8;
  auVar45._28_4_ = iVar8;
  auVar43 = vpmulld_avx2(auVar51,(undefined1  [32])*in);
  auVar40 = vpmulld_avx2(auVar60,auVar64);
  auVar55 = vpmulld_avx2(auVar57,auVar45);
  auVar40 = vpaddd_avx2(auVar40,auVar49);
  auVar40 = vpaddd_avx2(auVar40,auVar55);
  auVar41 = vpaddd_avx2(auVar49,auVar41);
  auVar62 = vpsrad_avx2(auVar41,auVar65);
  auVar41 = vpaddd_avx2(auVar49,auVar42);
  auVar16 = vpsrad_avx2(auVar41,auVar65);
  auVar46._4_4_ = iVar29;
  auVar46._0_4_ = iVar29;
  auVar46._8_4_ = iVar29;
  auVar46._12_4_ = iVar29;
  auVar46._16_4_ = iVar29;
  auVar46._20_4_ = iVar29;
  auVar46._24_4_ = iVar29;
  auVar46._28_4_ = iVar29;
  auVar41 = vpmulld_avx2(auVar16,auVar63);
  auVar41 = vpaddd_avx2(auVar41,auVar49);
  auVar42 = vpmulld_avx2(auVar62,auVar46);
  auVar41 = vpaddd_avx2(auVar42,auVar41);
  auVar55 = vpmulld_avx2(auVar62,auVar63);
  auVar42 = vpmulld_avx2(auVar16,auVar64);
  auVar42 = vpaddd_avx2(auVar42,auVar49);
  auVar42 = vpaddd_avx2(auVar42,auVar55);
  auVar55 = vpaddd_avx2(auVar11,auVar10);
  auVar11 = vpsubd_avx2(auVar10,auVar11);
  auVar10 = vpsrad_avx2(auVar58,auVar65);
  auVar48 = vpsrad_avx2(auVar48,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar10);
  auVar19 = vpsubd_avx2(auVar10,auVar48);
  auVar48 = vpaddd_avx2(auVar13,auVar14);
  auVar13 = vpsubd_avx2(auVar14,auVar13);
  auVar65 = ZEXT416((uint)bit);
  auVar10 = vpsrad_avx2(auVar56,auVar65);
  auVar38 = vpsrad_avx2(auVar38,auVar65);
  auVar56 = vpaddd_avx2(auVar38,auVar10);
  auVar14 = vpsubd_avx2(auVar38,auVar10);
  auVar38 = vpaddd_avx2(auVar59,auVar15);
  auVar59 = vpsubd_avx2(auVar15,auVar59);
  auVar10 = vpsrad_avx2(auVar44,auVar65);
  auVar50 = vpsrad_avx2(auVar50,auVar65);
  auVar44 = vpaddd_avx2(auVar50,auVar10);
  auVar20 = vpsubd_avx2(auVar50,auVar10);
  auVar50 = vpaddd_avx2(auVar9,auVar12);
  auVar10 = vpsubd_avx2(auVar9,auVar12);
  auVar9 = vpsrad_avx2(auVar53,auVar65);
  auVar54 = vpsrad_avx2(auVar54,auVar65);
  auVar53 = vpaddd_avx2(auVar54,auVar9);
  auVar9 = vpsubd_avx2(auVar9,auVar54);
  auVar47._4_4_ = iVar28;
  auVar47._0_4_ = iVar28;
  auVar47._8_4_ = iVar28;
  auVar47._12_4_ = iVar28;
  auVar47._16_4_ = iVar28;
  auVar47._20_4_ = iVar28;
  auVar47._24_4_ = iVar28;
  auVar47._28_4_ = iVar28;
  auVar54 = vpaddd_avx2(auVar49,auVar52);
  auVar15 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpaddd_avx2(auVar49,auVar61);
  auVar17 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpmulld_avx2(auVar17,auVar47);
  auVar54 = vpaddd_avx2(auVar54,auVar49);
  auVar52 = vpmulld_avx2(auVar15,auVar51);
  auVar54 = vpaddd_avx2(auVar54,auVar52);
  auVar52 = vpaddd_avx2(auVar49,auVar43);
  auVar18 = vpsrad_avx2(auVar52,auVar65);
  auVar52 = vpaddd_avx2(auVar62,auVar60);
  auVar21 = vpsubd_avx2(auVar60,auVar62);
  auVar61 = vpsrad_avx2(auVar39,auVar65);
  auVar41 = vpsrad_avx2(auVar41,auVar65);
  auVar39 = vpaddd_avx2(auVar41,auVar61);
  auVar60 = vpsubd_avx2(auVar61,auVar41);
  auVar61 = vpsrad_avx2(auVar40,auVar65);
  auVar40 = vpaddd_avx2(auVar16,auVar57);
  auVar22 = vpsubd_avx2(auVar57,auVar16);
  auVar42 = vpsrad_avx2(auVar42,auVar65);
  auVar41 = vpaddd_avx2(auVar42,auVar61);
  auVar62 = vpsubd_avx2(auVar61,auVar42);
  auVar27._4_4_ = local_480;
  auVar27._0_4_ = local_480;
  auVar27._8_4_ = local_480;
  auVar27._12_4_ = local_480;
  auVar27._16_4_ = local_480;
  auVar27._20_4_ = local_480;
  auVar27._24_4_ = local_480;
  auVar27._28_4_ = local_480;
  auVar42 = vpmaxsd_avx2(auVar19,auVar27);
  auVar26._4_4_ = local_4a0;
  auVar26._0_4_ = local_4a0;
  auVar26._8_4_ = local_4a0;
  auVar26._12_4_ = local_4a0;
  auVar26._16_4_ = local_4a0;
  auVar26._20_4_ = local_4a0;
  auVar26._24_4_ = local_4a0;
  auVar26._28_4_ = local_4a0;
  auVar61 = vpminsd_avx2(auVar42,auVar26);
  auVar42 = vpmaxsd_avx2(auVar9,auVar27);
  auVar43 = vpminsd_avx2(auVar42,auVar26);
  auVar42 = vpmulld_avx2(auVar61,auVar63);
  auVar42 = vpaddd_avx2(auVar42,auVar49);
  auVar9 = vpmulld_avx2(auVar43,auVar64);
  auVar42 = vpaddd_avx2(auVar42,auVar9);
  auVar61 = vpmulld_avx2(auVar61,auVar64);
  auVar43 = vpmulld_avx2(auVar43,auVar45);
  auVar61 = vpaddd_avx2(auVar61,auVar49);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar43 = vpmaxsd_avx2(auVar27,auVar11);
  auVar9 = vpminsd_avx2(auVar43,auVar26);
  auVar43 = vpmaxsd_avx2(auVar10,auVar27);
  auVar10 = vpminsd_avx2(auVar43,auVar26);
  auVar43 = vpmulld_avx2(auVar10,auVar64);
  auVar43 = vpaddd_avx2(auVar43,auVar49);
  auVar11 = vpmulld_avx2(auVar9,auVar63);
  auVar43 = vpaddd_avx2(auVar11,auVar43);
  auVar10 = vpmulld_avx2(auVar10,auVar45);
  auVar11 = vpmulld_avx2(auVar9,auVar64);
  auVar9 = vpaddd_avx2(auVar49,auVar10);
  auVar9 = vpaddd_avx2(auVar11,auVar9);
  auVar10 = vpmaxsd_avx2(auVar27,auVar13);
  auVar11 = vpminsd_avx2(auVar10,auVar26);
  auVar10 = vpmaxsd_avx2(auVar27,auVar59);
  auVar12 = vpminsd_avx2(auVar10,auVar26);
  auVar10 = vpmulld_avx2(auVar12,auVar63);
  auVar10 = vpaddd_avx2(auVar49,auVar10);
  auVar59 = vpmulld_avx2(auVar11,auVar46);
  auVar10 = vpaddd_avx2(auVar59,auVar10);
  auVar59 = vpmulld_avx2(auVar11,auVar63);
  auVar11 = vpmulld_avx2(auVar12,auVar64);
  auVar11 = vpaddd_avx2(auVar11,auVar49);
  auVar11 = vpaddd_avx2(auVar11,auVar59);
  auVar12 = vpmaxsd_avx2(auVar27,auVar14);
  auVar59 = vpminsd_avx2(auVar12,auVar26);
  auVar12 = vpmaxsd_avx2(auVar27,auVar20);
  auVar13 = vpminsd_avx2(auVar12,auVar26);
  auVar12 = vpmulld_avx2(auVar59,auVar46);
  auVar12 = vpaddd_avx2(auVar12,auVar49);
  auVar14 = vpmulld_avx2(auVar13,auVar63);
  auVar12 = vpaddd_avx2(auVar14,auVar12);
  auVar59 = vpmulld_avx2(auVar59,auVar63);
  auVar13 = vpmulld_avx2(auVar13,auVar64);
  auVar57 = vpsrad_avx2(auVar54,auVar65);
  auVar54 = vpaddd_avx2(auVar59,auVar49);
  auVar54 = vpaddd_avx2(auVar54,auVar13);
  auVar59 = vpaddd_avx2(auVar17,auVar15);
  auVar59 = vpmulld_avx2(auVar59,auVar51);
  auVar59 = vpaddd_avx2(auVar59,auVar49);
  auVar14 = vpsrad_avx2(auVar59,auVar65);
  auVar59 = vpaddd_avx2(auVar15,auVar18);
  auVar19 = vpsubd_avx2(auVar18,auVar15);
  auVar13 = vpaddd_avx2(auVar14,auVar18);
  auVar20 = vpsubd_avx2(auVar18,auVar14);
  auVar14 = vpaddd_avx2(auVar57,auVar18);
  auVar45 = vpsubd_avx2(auVar18,auVar57);
  auVar15 = vpaddd_avx2(auVar17,auVar18);
  auVar46 = vpsubd_avx2(auVar18,auVar17);
  auVar57 = vpmaxsd_avx2(auVar27,auVar60);
  auVar60 = vpminsd_avx2(auVar57,auVar26);
  auVar57 = vpmaxsd_avx2(auVar27,auVar62);
  auVar62 = vpminsd_avx2(auVar57,auVar26);
  auVar57 = vpmulld_avx2(auVar60,auVar47);
  auVar57 = vpaddd_avx2(auVar57,auVar49);
  auVar16 = vpmulld_avx2(auVar62,auVar51);
  auVar57 = vpaddd_avx2(auVar57,auVar16);
  auVar60 = vpaddd_avx2(auVar62,auVar60);
  auVar62 = vpmaxsd_avx2(auVar27,auVar21);
  auVar16 = vpminsd_avx2(auVar62,auVar26);
  auVar62 = vpmaxsd_avx2(auVar27,auVar22);
  auVar17 = vpminsd_avx2(auVar62,auVar26);
  auVar62 = vpmulld_avx2(auVar16,auVar47);
  auVar62 = vpaddd_avx2(auVar62,auVar49);
  auVar18 = vpmulld_avx2(auVar17,auVar51);
  auVar62 = vpaddd_avx2(auVar62,auVar18);
  auVar16 = vpaddd_avx2(auVar17,auVar16);
  auVar55 = vpmaxsd_avx2(auVar27,auVar55);
  auVar55 = vpminsd_avx2(auVar55,auVar26);
  auVar48 = vpmaxsd_avx2(auVar27,auVar48);
  auVar17 = vpminsd_avx2(auVar48,auVar26);
  auVar48 = vpaddd_avx2(auVar17,auVar55);
  auVar55 = vpsubd_avx2(auVar55,auVar17);
  auVar48 = vpmaxsd_avx2(auVar48,auVar27);
  local_260 = vpminsd_avx2(auVar48,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar58);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar56);
  auVar56 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar56,auVar48);
  auVar17 = vpsubd_avx2(auVar48,auVar56);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_240 = vpminsd_avx2(auVar58,auVar26);
  auVar48 = vpsrad_avx2(auVar42,auVar65);
  auVar65 = ZEXT416((uint)bit);
  auVar56 = vpsrad_avx2(auVar12,auVar65);
  auVar58 = vpaddd_avx2(auVar56,auVar48);
  auVar42 = vpsubd_avx2(auVar48,auVar56);
  auVar48 = vpsrad_avx2(auVar43,auVar65);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_220 = vpminsd_avx2(auVar58,auVar26);
  auVar56 = vpsrad_avx2(auVar10,auVar65);
  auVar58 = vpaddd_avx2(auVar56,auVar48);
  auVar43 = vpsubd_avx2(auVar48,auVar56);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_200 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar38);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar50);
  auVar56 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar56,auVar48);
  auVar38 = vpsubd_avx2(auVar56,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_80 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar44);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar53);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar50 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_a0 = vpminsd_avx2(auVar58,auVar26);
  auVar53 = vpsrad_avx2(auVar61,auVar65);
  auVar48 = vpsrad_avx2(auVar54,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar61 = vpsubd_avx2(auVar53,auVar48);
  auVar53 = vpsrad_avx2(auVar9,auVar65);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_c0 = vpminsd_avx2(auVar58,auVar26);
  auVar48 = vpsrad_avx2(auVar11,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar9 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_e0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar40);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar59);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar48,auVar53);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_460 = (__m256i)vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_280 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar41);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar13);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar48,auVar53);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_440 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_2a0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar14);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmulld_avx2(auVar60,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar48 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_420 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_2c0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar15);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmulld_avx2(auVar16,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar48 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_400 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_2e0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar46);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar48 = vpsrad_avx2(auVar62,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_3e0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_300 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar45);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar48 = vpsrad_avx2(auVar57,auVar65);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar48);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_3c0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_320 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar39);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar20);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar53 = vpsubd_avx2(auVar48,auVar53);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  local_3a0 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar53,auVar27);
  local_340 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar52);
  auVar53 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpmaxsd_avx2(auVar27,auVar19);
  auVar48 = vpminsd_avx2(auVar58,auVar26);
  auVar58 = vpaddd_avx2(auVar48,auVar53);
  auVar40 = vpsubd_avx2(auVar48,auVar53);
  auVar53 = vpmaxsd_avx2(auVar27,auVar55);
  auVar48 = vpmaxsd_avx2(auVar27,auVar17);
  auVar54 = vpmaxsd_avx2(auVar27,auVar42);
  auVar56 = vpmaxsd_avx2(auVar43,auVar27);
  auVar44 = vpmaxsd_avx2(auVar38,auVar27);
  auVar38 = vpmaxsd_avx2(auVar50,auVar27);
  auVar50 = vpmaxsd_avx2(auVar61,auVar27);
  auVar39 = vpmaxsd_avx2(auVar9,auVar27);
  auVar58 = vpmaxsd_avx2(auVar58,auVar27);
  auVar40 = vpmaxsd_avx2(auVar40,auVar27);
  auVar41 = vpminsd_avx2(auVar53,auVar26);
  auVar48 = vpminsd_avx2(auVar48,auVar26);
  auVar54 = vpminsd_avx2(auVar54,auVar26);
  auVar53 = vpminsd_avx2(auVar56,auVar26);
  auVar56 = vpminsd_avx2(auVar44,auVar26);
  auVar44 = vpminsd_avx2(auVar38,auVar26);
  auVar38 = vpminsd_avx2(auVar50,auVar26);
  auVar50 = vpminsd_avx2(auVar39,auVar26);
  local_380 = vpminsd_avx2(auVar58,auVar26);
  local_360 = vpminsd_avx2(auVar40,auVar26);
  auVar58 = vpmulld_avx2(auVar53,auVar47);
  auVar39 = vpmulld_avx2(auVar50,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar58 = vpaddd_avx2(auVar58,auVar39);
  auVar53 = vpaddd_avx2(auVar53,auVar50);
  local_1e0 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpmulld_avx2(auVar53,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  local_100 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpmulld_avx2(auVar54,auVar47);
  auVar53 = vpmulld_avx2(auVar38,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar58 = vpaddd_avx2(auVar58,auVar53);
  auVar53 = vpaddd_avx2(auVar54,auVar38);
  local_1c0 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpmulld_avx2(auVar53,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  local_120 = vpsrad_avx2(auVar58,auVar65);
  auVar58 = vpmulld_avx2(auVar48,auVar47);
  auVar53 = vpmulld_avx2(auVar44,auVar51);
  auVar58 = vpaddd_avx2(auVar58,auVar49);
  auVar58 = vpaddd_avx2(auVar58,auVar53);
  auVar53 = vpaddd_avx2(auVar44,auVar48);
  auVar53 = vpmulld_avx2(auVar53,auVar51);
  auVar53 = vpaddd_avx2(auVar53,auVar49);
  local_140 = vpsrad_avx2(auVar53,auVar65);
  local_1a0 = vpsrad_avx2(auVar58,auVar65);
  auVar53 = vpmulld_avx2(auVar41,auVar47);
  auVar58 = vpmulld_avx2(auVar56,auVar51);
  auVar58 = vpaddd_avx2(auVar49,auVar58);
  auVar58 = vpaddd_avx2(auVar53,auVar58);
  auVar53 = vpaddd_avx2(auVar56,auVar41);
  auVar53 = vpmulld_avx2(auVar53,auVar51);
  auVar53 = vpaddd_avx2(auVar53,auVar49);
  local_180 = vpsrad_avx2(auVar58,auVar65);
  local_160 = vpsrad_avx2(auVar53,auVar65);
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_480,(__m256i *)&local_4a0
                    );
  return;
}

Assistant:

static void idct32_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[4] = in[4];
    bf1[8] = in[2];
    bf1[12] = in[6];
    bf1[16] = in[1];
    bf1[20] = in[5];
    bf1[24] = in[3];
    bf1[28] = in[7];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);

    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);
    bf1[17] = bf1[16];
    bf1[18] = bf1[19];
    bf1[21] = bf1[20];
    bf1[22] = bf1[23];
    bf1[25] = bf1[24];
    bf1[26] = bf1[27];
    bf1[29] = bf1[28];
    bf1[30] = bf1[31];

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);

    bf1[9] = bf1[8];
    bf1[10] = bf1[11];
    bf1[13] = bf1[12];
    bf1[14] = bf1[15];

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[5] = bf1[4];
    bf1[6] = bf1[7];

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    bf1[3] = bf1[0];
    bf1[2] = bf1[1];

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}